

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bias.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeBias(ConvertLayerParameters layerParameters)

{
  string *psVar1;
  string *psVar2;
  uint64 uVar3;
  uint64 uVar4;
  pointer plVar5;
  int iVar6;
  Type *caffeLayer;
  Type *pTVar7;
  Type *pTVar8;
  Type *pTVar9;
  BlobShape *pBVar10;
  NeuralNetworkLayer *pNVar11;
  int64 iVar12;
  BiasLayerParams *this;
  WeightParams *pWVar13;
  BiasParameter *pBVar14;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *pRVar15;
  int iVar16;
  uint64 *puVar17;
  RepeatedPtrField<caffe::BlobProto> *this_00;
  allocator local_ca;
  allocator local_c9;
  string local_c8;
  _Vector_base<long,_std::allocator<long>_> local_a8;
  string local_90;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                          *layerParameters.layerId);
  iVar6 = getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,iVar6);
  pBVar14 = caffeLayer->bias_param_;
  if (pBVar14 == (BiasParameter *)0x0) {
    pBVar14 = (BiasParameter *)&caffe::_BiasParameter_default_instance_;
  }
  if (1 < (caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ - 1U) {
    std::__cxx11::string::string
              ((string *)&local_c8,"Must have 1 or 2 input(s)",(allocator *)&local_90);
    errorInCaffeProto(&local_c8,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    std::__cxx11::string::string((string *)&local_c8,"Must have 1 output",(allocator *)&local_90);
    errorInCaffeProto(&local_c8,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  local_70 = layerParameters.nnWrite;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(caffeLayer->top_).super_RepeatedPtrFieldBase,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&top,pTVar8);
  iVar6 = (caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if ((iVar6 == 1) && ((pTVar7->blobs_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    std::__cxx11::string::string
              ((string *)&local_c8,"Bias parameters not found.",(allocator *)&local_90);
    errorInCaffeProto(&local_c8,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  iVar16 = pBVar14->axis_;
  if ((iVar16 + 4U < 8) && ((0x99U >> (iVar16 + 4U & 0x1f) & 1) != 0)) {
    std::__cxx11::string::string((string *)&local_c8,"axis",(allocator *)&local_a8);
    psVar1 = (caffeLayer->name_).ptr_;
    psVar2 = (caffeLayer->type_).ptr_;
    std::__cxx11::to_string(&local_90,pBVar14->axis_);
    unsupportedCaffeParrameterWithOption(&local_c8,psVar1,psVar2,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_c8);
    iVar16 = pBVar14->axis_;
  }
  if (iVar16 == 1) {
    if (iVar6 == 1) {
LAB_00473f3b:
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                         (&(pTVar7->blobs_).super_RepeatedPtrFieldBase,0);
      pBVar10 = pTVar9->shape_;
      if (pBVar10 == (BlobShape *)0x0) {
        pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      if ((pBVar10->dim_).current_size_ == 2) {
        std::__cxx11::string::string
                  ((string *)&local_c8,"Bias of size 2D when axis = 1 is currently not supported",
                   (allocator *)&local_90);
        errorInCaffeProto(&local_c8,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      iVar16 = pBVar14->axis_;
      goto LAB_00473f97;
    }
  }
  else {
    if ((iVar6 == 1) && (iVar16 == -3)) goto LAB_00473f3b;
LAB_00473f97:
    if (iVar16 != 2) {
      if ((iVar6 == 1) && (iVar16 == -2)) {
LAB_0047405a:
        pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                           (&(pTVar7->blobs_).super_RepeatedPtrFieldBase,0);
        pRVar15 = local_70;
        pBVar10 = pTVar9->shape_;
        if (pBVar10 == (BlobShape *)0x0) {
          pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        if ((pBVar10->dim_).current_size_ == 1) {
          std::__cxx11::string::string
                    ((string *)&local_c8,"Bias of size 1D when axis = 2 is currently not supported",
                     (allocator *)&local_90);
          errorInCaffeProto(&local_c8,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
          std::__cxx11::string::~string((string *)&local_c8);
        }
      }
      else {
        pRVar15 = local_70;
        if (iVar6 != 1) goto LAB_00473fbd;
      }
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      this_00 = &pTVar7->blobs_;
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,0);
      pBVar10 = pTVar9->shape_;
      if (pBVar10 == (BlobShape *)0x0) {
        pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      iVar16 = 1;
      iVar6 = (pBVar10->dim_).current_size_;
      if (iVar6 != 0) {
        if (iVar6 == 1) {
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          pBVar10 = pTVar9->shape_;
          if (pBVar10 == (BlobShape *)0x0) {
            pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          local_c8._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar10,0);
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)&local_a8,(long *)&local_c8);
          iVar16 = (int)local_a8._M_impl.super__Vector_impl_data._M_finish[-1];
        }
        else if (iVar6 == 2) {
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          pBVar10 = pTVar9->shape_;
          if (pBVar10 == (BlobShape *)0x0) {
            pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          local_c8._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar10,0);
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)&local_a8,(long *)&local_c8);
          uVar3 = local_a8._M_impl.super__Vector_impl_data._M_finish[-1];
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          pBVar10 = pTVar9->shape_;
          if (pBVar10 == (BlobShape *)0x0) {
            pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          local_c8._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar10,1);
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)&local_a8,(long *)&local_c8);
          iVar16 = (int)uVar3 * (int)local_a8._M_impl.super__Vector_impl_data._M_finish[-1];
        }
        else if (iVar6 - 3U < 2) {
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          pBVar10 = pTVar9->shape_;
          if (pBVar10 == (BlobShape *)0x0) {
            pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          local_c8._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar10,iVar6 - 3U);
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)&local_a8,(long *)&local_c8);
          uVar3 = local_a8._M_impl.super__Vector_impl_data._M_finish[-1];
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          pBVar10 = pTVar9->shape_;
          if (pBVar10 == (BlobShape *)0x0) {
            pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          local_c8._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar10,iVar6 + -2);
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)&local_a8,(long *)&local_c8);
          uVar4 = local_a8._M_impl.super__Vector_impl_data._M_finish[-1];
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          pBVar10 = pTVar9->shape_;
          if (pBVar10 == (BlobShape *)0x0) {
            pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          local_c8._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar10,iVar6 + -1);
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)&local_a8,(long *)&local_c8);
          iVar16 = (int)uVar3 * (int)uVar4 *
                   (int)local_a8._M_impl.super__Vector_impl_data._M_finish[-1];
          if (iVar6 == 4) {
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                               (&this_00->super_RepeatedPtrFieldBase,0);
            pBVar10 = pTVar9->shape_;
            if (pBVar10 == (BlobShape *)0x0) {
              pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
            }
            iVar12 = caffe::BlobShape::dim(pBVar10,0);
            if (iVar12 != 1) {
              std::__cxx11::string::string((string *)&local_c8,"bias",&local_c9);
              psVar1 = (caffeLayer->name_).ptr_;
              psVar2 = (caffeLayer->type_).ptr_;
              std::__cxx11::string::string
                        ((string *)&local_90,"4D bias only supported when 1st dimension is 1",
                         &local_ca);
              unsupportedCaffeParrameterWithOption(&local_c8,psVar1,psVar2,&local_90);
              goto LAB_0047437c;
            }
          }
        }
        else {
          std::__cxx11::string::string((string *)&local_c8,"bias",&local_c9);
          psVar1 = (caffeLayer->name_).ptr_;
          psVar2 = (caffeLayer->type_).ptr_;
          std::__cxx11::string::string((string *)&local_90,">4D bias not supported",&local_ca);
          unsupportedCaffeParrameterWithOption(&local_c8,psVar1,psVar2,&local_90);
LAB_0047437c:
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_c8);
        }
      }
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,0);
      if ((pTVar9->data_).current_size_ != iVar16) {
        std::__cxx11::string::string
                  ((string *)&local_c8,"Bias blob\'s size inconsistent with the blob dimensions",
                   (allocator *)&local_90);
        errorInCaffeProto(&local_c8,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      pNVar11 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          (pRVar15);
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&bottom,pTVar8);
      convertCaffeMetadata
                ((caffeLayer->name_).ptr_,&bottom,&top,pRVar15,layerParameters.mappingDataBlobNames)
      ;
      this = CoreML::Specification::NeuralNetworkLayer::mutable_bias(pNVar11);
      plVar5 = local_a8._M_impl.super__Vector_impl_data._M_finish;
      for (puVar17 = (uint64 *)local_a8._M_impl.super__Vector_impl_data._M_start;
          puVar17 != (uint64 *)plVar5; puVar17 = puVar17 + 1) {
        if ((long)*puVar17 < 0) {
          __assert_fail("dim >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Bias.cpp"
                        ,0x90,
                        "void CoreMLConverter::convertCaffeBias(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        CoreML::Specification::BiasLayerParams::add_shape(this,*puVar17);
      }
      pWVar13 = CoreML::Specification::BiasLayerParams::mutable_bias(this);
      local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
      google::protobuf::RepeatedField<float>::Resize
                (&pWVar13->floatvalue_,iVar16,(float *)&local_c8);
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,0);
      google::protobuf::RepeatedField<float>::CopyFrom(&pWVar13->floatvalue_,&pTVar9->data_);
      goto LAB_0047448d;
    }
    if (iVar6 == 1) goto LAB_0047405a;
  }
LAB_00473fbd:
  pRVar15 = local_70;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pNVar11 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (local_70);
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&bottom,pTVar8);
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&bottom,pTVar8);
  std::operator+(&local_c8,(caffeLayer->name_).ptr_,"_add");
  convertCaffeMetadata(&local_c8,&bottom,&top,pRVar15,layerParameters.mappingDataBlobNames);
  std::__cxx11::string::~string((string *)&local_c8);
  CoreML::Specification::NeuralNetworkLayer::mutable_add(pNVar11);
LAB_0047448d:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeBias(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    const caffe::BiasParameter& caffeLayerParams =  caffeLayer.bias_param();
    
    #pragma unused(caffeLayerWeights)
    
    /* CoreML Bias layer does not support all the functionality of Caffe Bias layer.
     Certain error modes can only be detected at compile time when we have input shapes available.
     Such errors cannot be detected at conversion time.
     */
    if (caffeLayer.bottom_size() == 2){
        /*
        WARNING: Caffe Bias layer is currently not fully supported in CoreML.
        Conversion will proceed but certain modes exercised in Caffe may lead to error during compilation/runtime.
        Please refer to the CoreML documentation to see what is supported.
         */
    }
    
    /*
     Caffe can have bias as either an additional input or as a learned parameter. If former, there will be 2 bottoms,
     otherwise 1.
     if bottom_size == 1 => add an CoreML "bias" layer
     if bottom_size == 2 => add an MLkit "add" layer.     
     */
    
    if (! (caffeLayer.bottom_size() == 1 || caffeLayer.bottom_size() == 2)){
        CoreMLConverter::errorInCaffeProto("Must have 1 or 2 input(s)",caffeLayer.name(),caffeLayer.type());
    }
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    auto* nnWrite = layerParameters.nnWrite;
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    
    int nBottom = caffeLayer.bottom_size();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (nBottom == 1){
        if (caffeLayerWeights.blobs_size() != 1){
            CoreMLConverter::errorInCaffeProto("Bias parameters not found.",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (caffeLayerParams.axis() == 0 || caffeLayerParams.axis() == -4 ||
        caffeLayerParams.axis() == 3 || caffeLayerParams.axis() == -1 ) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),
                                                             std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Bias of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Bias of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    //***************************************************************
    
    /*
     Get params related to bias when it is a learned parameter
     */
    std::vector<int64_t> biasShape;
    int biasSize = 1;
    if (nBottom == 1) {
        
        int dimSize = caffeLayerWeights.blobs(0).shape().dim_size();
        
        if (dimSize == 0){
            biasSize = 1;
        } else if (dimSize == 1){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            biasSize *= biasShape.back();
        } else if (dimSize == 2){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(1));
            biasSize *= biasShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-3));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-2));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-1));
            biasSize *= biasShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(0).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D bias only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D bias not supported");
        }
        if (caffeLayerWeights.blobs(0).data_size() != biasSize){
            CoreMLConverter::errorInCaffeProto("Bias blob's size inconsistent with the blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Add appropriate CoreML layer(s) now
     */
    
    if (nBottom == 1){
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::BiasLayerParams* specLayerParams = specLayer->mutable_bias();
        for (const auto& dim: biasShape){
            assert(dim >= 0);
            specLayerParams->add_shape(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize(biasSize, 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    } else {
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_add",
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        (void) specLayer->mutable_add();
    }
}